

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_frame_core
          (dwarf_resolver *this,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  Dwarf_Addr pc;
  Dwarf_Half DVar1;
  cu_info *pcVar2;
  die_object *cu_die;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  dwo_name;
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> cu;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  local_90;
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0> local_68;
  
  pc = object_frame_info->object_address;
  lookup_cu(&local_68,this,pc);
  if (local_68.holds_value == true) {
    pcVar2 = optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::unwrap(&local_68);
    cu_die = maybe_owned_die_object::get(&pcVar2->cu_die);
    get_dwo_name_abi_cxx11_(&local_90,this,cu_die);
    DVar1 = die_object::get_tag(cu_die);
    if ((DVar1 == 0x4a) ||
       ((local_90.holds_value == true && ((this->skeleton).holds_value == false)))) {
      perform_dwarf_fission_resolution(this,cu_die,&local_90,object_frame_info,frame,inlines);
    }
    else {
      retrieve_line_info(this,cu_die,pc,frame);
      pcVar2 = optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::unwrap(&local_68);
      retrieve_symbol(this,cu_die,pc,pcVar2->dwversion,frame,inlines);
    }
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    reset(&local_90);
  }
  optional<cpptrace::detail::libdwarf::dwarf_resolver::cu_info,_0>::reset(&local_68);
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void resolve_frame_core(
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            auto pc = object_frame_info.object_address;
            if(dump_dwarf) {
                std::fprintf(stderr, "%s\n", object_path.c_str());
                std::fprintf(stderr, "%llx\n", to_ull(pc));
            }
            optional<cu_info> cu = lookup_cu(pc);
            if(cu) {
                const auto& cu_die = cu.unwrap().cu_die.get();
                // gnu non-standard debug-fission may create non-skeleton CU DIEs and just add dwo attributes
                // clang emits dwo names in the split CUs, so guard against going down the dwarf fission path (which
                // doesn't infinitely recurse because it's not emitted as an absolute path and there's no comp dir but
                // it's good to guard against the infinite recursion anyway)
                auto dwo_name = get_dwo_name(cu_die);
                if(cu_die.get_tag() == DW_TAG_skeleton_unit || (dwo_name && !skeleton)) {
                    perform_dwarf_fission_resolution(cu_die, dwo_name, object_frame_info, frame, inlines);
                } else {
                    retrieve_line_info(cu_die, pc, frame);
                    retrieve_symbol(cu_die, pc, cu.unwrap().dwversion, frame, inlines);
                }
            }
        }